

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_graphicsmagick_external
          (CImg<unsigned_char> *this,char *filename)

{
  FILE *pFVar1;
  CImg<char> *pCVar2;
  char *pcVar3;
  char *pcVar4;
  CImgArgumentException *this_00;
  CImgIOException *this_01;
  ulong uVar5;
  char *pcVar6;
  CImg<char> filename_tmp;
  CImg<char> command;
  CImg<char> local_70;
  CImg<char> s_filename;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar6 = "non-";
    if (this->_is_shared != false) {
      pcVar6 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar6,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  pFVar1 = cimg::fopen(filename,"rb");
  fclose(pFVar1);
  CImg<char>::CImg(&command,0x400,1,1,1);
  CImg<char>::CImg(&filename_tmp,0x100,1,1,1);
  CImg<char>::string(&local_70,filename,true,false);
  pCVar2 = CImg<char>::_system_strescape(&local_70);
  CImg<char>::CImg(&s_filename,pCVar2);
  CImg<char>::~CImg(&local_70);
  pcVar6 = command._data;
  uVar5 = (ulong)command._width;
  pcVar3 = cimg::graphicsmagick_path((char *)0x0,false);
  snprintf(pcVar6,uVar5,"%s convert \"%s\" pnm:-",pcVar3,s_filename._data);
  pFVar1 = popen(command._data,"r");
  if (pFVar1 == (FILE *)0x0) {
    while( true ) {
      pcVar6 = filename_tmp._data;
      uVar5 = (ulong)filename_tmp._width;
      pcVar3 = cimg::temporary_path((char *)0x0,false);
      pcVar4 = cimg::filenamerand();
      snprintf(pcVar6,uVar5,"%s%c%s.pnm",pcVar3,0x2f,pcVar4);
      pFVar1 = fopen(filename_tmp._data,"rb");
      pcVar6 = command._data;
      if (pFVar1 == (FILE *)0x0) break;
      cimg::fclose(pFVar1);
    }
    pcVar3 = cimg::graphicsmagick_path((char *)0x0,false);
    CImg<char>::string(&local_70,filename_tmp._data,true,false);
    pCVar2 = CImg<char>::_system_strescape(&local_70);
    snprintf(pcVar6,(ulong)command._width,"%s convert \"%s\" \"%s\"",pcVar3,s_filename._data,
             pCVar2->_data);
    CImg<char>::~CImg(&local_70);
    cimg::graphicsmagick_path((char *)0x0,false);
    cimg::system(command._data);
    pFVar1 = fopen(filename_tmp._data,"rb");
    if (pFVar1 == (FILE *)0x0) {
      pFVar1 = cimg::fopen(filename,"r");
      cimg::fclose(pFVar1);
      this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
      pcVar6 = "non-";
      if (this->_is_shared != false) {
        pcVar6 = "";
      }
      CImgIOException::CImgIOException
                (this_01,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external(): Failed to load file \'%s\' with external command \'gm\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar6,"unsigned char",filename);
      __cxa_throw(this_01,&CImgIOException::typeinfo,CImgException::~CImgException);
    }
    cimg::fclose(pFVar1);
    load_pnm(this,filename_tmp._data);
    remove(filename_tmp._data);
  }
  else {
    cimg::exception_mode();
    cimg::exception_mode(0);
    load_pnm(this,(FILE *)pFVar1);
    pclose(pFVar1);
  }
  CImg<char>::~CImg(&s_filename);
  CImg<char>::~CImg(&filename_tmp);
  CImg<char>::~CImg(&command);
  return this;
}

Assistant:

CImg<T>& load_graphicsmagick_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_graphicsmagick_external(): Specified filename is (null).",
                                    cimg_instance);
      std::fclose(cimg::fopen(filename,"rb"));            // Check if file exists.
      CImg<charT> command(1024), filename_tmp(256);
      std::FILE *file = 0;
      const CImg<charT> s_filename = CImg<charT>::string(filename)._system_strescape();
#if cimg_OS==1
      cimg_snprintf(command,command._width,"%s convert \"%s\" pnm:-",
                    cimg::graphicsmagick_path(),s_filename.data());
      file = popen(command,"r");
      if (file) {
        const unsigned int omode = cimg::exception_mode();
        cimg::exception_mode(0);
        try { load_pnm(file); } catch (...) {
          pclose(file);
          cimg::exception_mode(omode);
          throw CImgIOException(_cimg_instance
                                "load_graphicsmagick_external(): Failed to load file '%s' with external command 'gm'.",
                                cimg_instance,
                                filename);
        }
        pclose(file);
        return *this;
      }
#endif
      do {
        cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.pnm",
                      cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        if ((file=std::fopen(filename_tmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,command._width,"%s convert \"%s\" \"%s\"",
                    cimg::graphicsmagick_path(),s_filename.data(),
                    CImg<charT>::string(filename_tmp)._system_strescape().data());
      cimg::system(command,cimg::graphicsmagick_path());
      if (!(file = std::fopen(filename_tmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_graphicsmagick_external(): Failed to load file '%s' with external command 'gm'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load_pnm(filename_tmp);
      std::remove(filename_tmp);
      return *this;
    }